

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

int interior_bounds_check(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  
  bVar1 = state->roomdef_dimensions_index;
  uVar2 = (state->saved_mappos).pos16.u;
  if (((((ushort)(interior_bounds_check::roomdef_dimensions[bVar1].x0 + 4) < uVar2) &&
       (uVar2 <= interior_bounds_check::roomdef_dimensions[bVar1].x1)) &&
      (uVar3 = (state->saved_mappos).pos16.v,
      interior_bounds_check::roomdef_dimensions[bVar1].y0 < uVar3)) &&
     ((int)(uint)uVar3 <= (int)(interior_bounds_check::roomdef_dimensions[bVar1].y1 - 4))) {
    if (state->roomdef_object_bounds_count != '\0') {
      lVar4 = 0;
      do {
        if ((((ushort)state->roomdef_object_bounds[lVar4].x0 <= (uVar2 & 0xff)) &&
            ((uVar2 & 0xff) < (ushort)state->roomdef_object_bounds[lVar4].x1)) &&
           (((ushort)state->roomdef_object_bounds[lVar4].y0 <= (uVar3 & 0xff) &&
            ((byte)uVar3 < state->roomdef_object_bounds[lVar4].y1)))) goto LAB_0010946e;
        lVar4 = lVar4 + 1;
      } while (state->roomdef_object_bounds_count != (uint8_t)lVar4);
    }
    return 0;
  }
LAB_0010946e:
  vischar->counter_and_flags = vischar->counter_and_flags ^ 0x20;
  return 1;
}

Assistant:

int interior_bounds_check(tgestate_t *state, vischar_t *vischar)
{
  /* Like a bounds_t but the elements are in a wacky order. */
  // FUTURE: Re-order the structure members into a bounds_t.
  typedef struct wackybounds
  {
    uint8_t x1, x0, y1, y0;
  }
  wackybounds_t;

  /**
   * $6B85: Room dimensions.
   */
  static const wackybounds_t roomdef_dimensions[10] =
  {
    {  66, 26,  70, 22 },
    {  62, 22,  58, 26 },
    {  54, 30,  66, 18 },
    {  62, 30,  58, 34 },
    {  74, 18,  62, 30 },
    {  56, 50, 100, 10 },
    { 104,  6,  56, 50 },
    {  56, 50, 100, 26 },
    { 104, 28,  56, 50 },
    {  56, 50,  88, 10 },
  };

  const wackybounds_t *room_bounds;   /* was BC */
  const mappos16_t    *saved_mappos;  /* was HL */
  const bounds_t      *object_bounds; /* was HL */
  uint8_t              nbounds;       /* was B */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  room_bounds = &roomdef_dimensions[state->roomdef_dimensions_index];
  saved_mappos = &state->saved_mappos.pos16;
  /* Conv: Merged conditions, flipped compares and reordered. */
  // inclusive/exclusive bounds look strange here
  if (saved_mappos->u <= room_bounds->x0 + 4 || saved_mappos->u > room_bounds->x1 ||
      saved_mappos->v <= room_bounds->y0     || saved_mappos->v > room_bounds->y1 - 4)
  {
    goto hit_bounds;
  }

  object_bounds = &state->roomdef_object_bounds[0]; /* Conv: Moved around. */
  for (nbounds = state->roomdef_object_bounds_count; nbounds > 0; nbounds--)
  {
    mappos16_t *mappos; /* was DE */
    uint8_t     u, v;   /* was A, A */

    /* Conv: HL dropped. */
    mappos = &state->saved_mappos.pos16;

    /* Conv: Two-iteration loop unrolled. */
    u = mappos->u; // note: narrowing // saved_mappos must be 8-bit
    if (u < object_bounds->x0 || u >= object_bounds->x1)
      goto next;
    v = mappos->v; // note: narrowing
    if (v < object_bounds->y0 || v >= object_bounds->y1)
      goto next;

hit_bounds:
    /* Toggle movement direction preference. */
    vischar->counter_and_flags ^= vischar_BYTE7_V_DOMINANT;
    return 1; /* return NZ */

next:
    /* Next iteration. */
    object_bounds++;
  }

  /* Encountered no bounds. */
  return 0; /* return Z */
}